

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O1

float3 * ConvexDecomposition::operator-=(float3 *a,float3 *b)

{
  a->x = a->x - b->x;
  a->y = a->y - b->y;
  a->z = a->z - b->z;
  return a;
}

Assistant:

float3& operator-=( float3& a , const float3& b )
{
		a.x -= b.x;
		a.y -= b.y;
		a.z -= b.z;
		return a;
}